

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateDefaultOptionalValues(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  uint32 uVar2;
  Rep *pRVar3;
  ModelDescription *pMVar4;
  ArrayFeatureType *pAVar5;
  Result *pRVar6;
  FeatureType *this;
  long lVar7;
  void **ppvVar8;
  allocator local_59;
  Result *local_58;
  string local_50;
  
  pMVar4 = format->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar3 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  iVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar7 = 0;
  local_58 = __return_storage_ptr__;
  do {
    pRVar6 = local_58;
    if ((long)iVar1 * 8 == lVar7) {
      Result::Result(local_58);
      return pRVar6;
    }
    this = *(FeatureType **)(*(long *)((long)ppvVar8 + lVar7) + 0x20);
    if (this == (FeatureType *)0x0) {
      this = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    if (this->isoptional_ == true) {
      pAVar5 = Specification::FeatureType::multiarraytype(this);
      if (((ulong)pAVar5->_oneof_case_[1] < 0x3e) &&
         ((0x2008020000000000U >> ((ulong)pAVar5->_oneof_case_[1] & 0x3f) & 1) != 0)) {
        uVar2 = format->_oneof_case_[0];
        if ((uVar2 != 0x12f) && ((uVar2 != 0x193 && (uVar2 != 500)))) {
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "Default optional values are only allowed for neural networks.",&local_59);
          pRVar6 = local_58;
          Result::Result(local_58,INVALID_MODEL_PARAMETERS,&local_50);
LAB_0020fdba:
          std::__cxx11::string::~string((string *)&local_50);
          return pRVar6;
        }
        if (format->specificationversion_ < 5) {
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!"
                     ,&local_59);
          pRVar6 = local_58;
          Result::Result(local_58,INVALID_MODEL_INTERFACE,&local_50);
          goto LAB_0020fdba;
        }
      }
    }
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

inline Result validateDefaultOptionalValues(const Specification::Model& format) {
        // - Validate default optional values for NN Model that
        //   - Has default value set if input is optional and spec 5 model
        // - Error out if model is not Neural Network
        const Specification::ModelDescription& description = format.description();

        for (const auto& input : description.input()) {
            if (input.type().isoptional()) {
                switch (input.type().multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        // Default value for optional inputs is applicable
                        // only for NeuralNetwork models with Spec 5 (iOS 14) onwards.
                        if (format.Type_case() != Specification::Model::kNeuralNetwork &&
                            format.Type_case() != Specification::Model::kNeuralNetworkRegressor &&
                            format.Type_case() != Specification::Model::kNeuralNetworkClassifier) {
                            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                          "Default optional values are only allowed for neural networks.");
                        }
                        if (format.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS14) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!");
                        }
                        break;
                    default:
                        break;
                }
            }
        }
        return Result();
    }